

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDeprecated.cpp
# Opt level: O0

HighsStatus __thiscall Highs::setHighsOptionValue(Highs *this,string *option,double value)

{
  HighsStatus HVar1;
  Highs *in_RDI;
  double in_stack_ffffffffffffff68;
  string *option_00;
  string *alt_method_name;
  string *in_stack_ffffffffffffff88;
  Highs *in_stack_ffffffffffffff90;
  undefined1 local_39 [57];
  
  alt_method_name = (string *)local_39;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_39 + 1),"setHighsOptionValue",(allocator *)alt_method_name);
  option_00 = (string *)&stack0xffffffffffffff8f;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff90,"setOptionValue",(allocator *)option_00);
  deprecationMessage(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,alt_method_name);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff8f);
  std::__cxx11::string::~string((string *)(local_39 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_39);
  HVar1 = setOptionValue(in_RDI,option_00,in_stack_ffffffffffffff68);
  return HVar1;
}

Assistant:

HighsStatus Highs::setHighsOptionValue(const std::string& option,
                                       const double value) {
  deprecationMessage("setHighsOptionValue", "setOptionValue");
  return setOptionValue(option, value);
}